

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Joint.h
# Opt level: O0

void __thiscall RigidBodyDynamics::Joint::Joint(Joint *this,SpatialVector *axis_0)

{
  undefined1 auVar1 [16];
  bool bVar2;
  SpatialVector *axis;
  ulong uVar3;
  CoeffReturnType pdVar4;
  Joint *pJVar5;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RSI;
  undefined8 *in_RDI;
  SpatialVector_t *in_stack_fffffffffffffe28;
  undefined1 *index;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0> *in_stack_fffffffffffffe30;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffe38;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffe40;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *this_00;
  Joint *local_1a0;
  Joint *this_01;
  double *in_stack_fffffffffffffe88;
  double *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  double *in_stack_fffffffffffffea0;
  double *in_stack_fffffffffffffea8;
  SpatialVector_t *in_stack_fffffffffffffeb0;
  double *in_stack_fffffffffffffec0;
  
  *(undefined4 *)((long)in_RDI + 0xc) = 1;
  axis = (SpatialVector *)CONCAT44(0,*(uint *)((long)in_RDI + 0xc));
  auVar1._8_8_ = 0;
  auVar1._0_8_ = axis;
  uVar3 = SUB168(auVar1 * ZEXT816(0x30),0);
  if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  local_1a0 = (Joint *)operator_new__(uVar3);
  this_01 = local_1a0;
  if (axis != (SpatialVector *)0x0) {
    pJVar5 = local_1a0 + (long)axis * 2;
    do {
      SpatialVector_t::SpatialVector_t((SpatialVector_t *)0x848d79);
      local_1a0 = local_1a0 + 2;
    } while (local_1a0 != pJVar5);
  }
  *in_RDI = this_01;
  SpatialVector_t::SpatialVector_t
            ((SpatialVector_t *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28)
  ;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
             in_stack_fffffffffffffec0);
  bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  if (bVar2) {
    *(undefined4 *)(in_RDI + 1) = 3;
  }
  else {
    this_00 = in_RSI;
    SpatialVector_t::SpatialVector_t
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
               in_stack_fffffffffffffec0);
    bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==
                      (this_00,in_stack_fffffffffffffe38);
    if (bVar2) {
      *(undefined4 *)(in_RDI + 1) = 4;
    }
    else {
      index = &stack0xfffffffffffffe88;
      SpatialVector_t::SpatialVector_t
                ((SpatialVector_t *)0x0,(double *)0x0,(double *)0x3ff0000000000000,(double *)0x0,
                 (double *)0x0,(double *)0x0,in_stack_fffffffffffffec0);
      bVar2 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator==(this_00,in_RSI);
      if (bVar2) {
        *(undefined4 *)(in_RDI + 1) = 5;
      }
      else {
        pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                           (in_stack_fffffffffffffe30,(Index)index);
        if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
          pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                             (in_stack_fffffffffffffe30,(Index)index);
          if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
            pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>::operator[]
                               (in_stack_fffffffffffffe30,(Index)index);
            if ((*pdVar4 == 0.0) && (!NAN(*pdVar4))) {
              *(undefined4 *)(in_RDI + 1) = 2;
              goto LAB_008490a5;
            }
          }
        }
        *(undefined4 *)(in_RDI + 1) = 0xd;
      }
    }
  }
LAB_008490a5:
  validate_spatial_axis(this_01,axis);
  return;
}

Assistant:

Joint (
    const Math::SpatialVector &axis_0
  )
  {
    mDoFCount = 1;
    mJointAxes = new Math::SpatialVector[mDoFCount];
    mJointAxes[0] = Math::SpatialVector (axis_0);
    
    // TODO this has to be properly determined AND test case. Try Matt's dot product idea
#ifdef RBDL_USE_CASADI_MATH
    if (!axis_0[0].is_zero()) {
#else
    if (axis_0 == Math::SpatialVector(1., 0., 0., 0., 0., 0.)) {
#endif
      mJointType = JointTypeRevoluteX;
#ifdef RBDL_USE_CASADI_MATH
    } else if (!axis_0[1].is_zero()) {
#else
    } else if (axis_0 == Math::SpatialVector(0., 1., 0., 0., 0., 0.)) {
#endif
      mJointType = JointTypeRevoluteY;
#ifdef RBDL_USE_CASADI_MATH
    } else if (!axis_0[2].is_zero()) {
#else
    } else if (axis_0 == Math::SpatialVector(0., 0., 1., 0., 0., 0.)) {
#endif
      mJointType = JointTypeRevoluteZ;
#ifdef RBDL_USE_CASADI_MATH
    } else if (axis_0[0].is_zero() && axis_0[1].is_zero() && axis_0[2].is_zero()) {
#else
    } else if (axis_0[0] == 0. && axis_0[1] == 0. && axis_0[2] == 0.) {
#endif
      mJointType = JointTypePrismatic;
    } else {
      mJointType = JointTypeHelical;
    }
    validate_spatial_axis (mJointAxes[0]);
  }

  /** \brief Constructs a 2 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1
  )
  {
    mJointType = JointType2DoF;
    mDoFCount = 2;

    mJointAxes = new Math::SpatialVector[mDoFCount];
    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
  }

  /** \brief Constructs a 3 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   * \param axis_2 Motion subspace for axis 2
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1,
    const Math::SpatialVector &axis_2
  )
  {
    mJointType = JointType3DoF;
    mDoFCount = 3;

    mJointAxes = new Math::SpatialVector[mDoFCount];

    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;
    mJointAxes[2] = axis_2;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
    validate_spatial_axis (mJointAxes[2]);
  }

  /** \brief Constructs a 4 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   * \param axis_2 Motion subspace for axis 2
   * \param axis_3 Motion subspace for axis 3
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1,
    const Math::SpatialVector &axis_2,
    const Math::SpatialVector &axis_3
  )
  {
    mJointType = JointType4DoF;
    mDoFCount = 4;

    mJointAxes = new Math::SpatialVector[mDoFCount];

    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;
    mJointAxes[2] = axis_2;
    mJointAxes[3] = axis_3;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
    validate_spatial_axis (mJointAxes[2]);
    validate_spatial_axis (mJointAxes[3]);
  }

  /** \brief Constructs a 5 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   * \param axis_2 Motion subspace for axis 2
   * \param axis_3 Motion subspace for axis 3
   * \param axis_4 Motion subspace for axis 4
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1,
    const Math::SpatialVector &axis_2,
    const Math::SpatialVector &axis_3,
    const Math::SpatialVector &axis_4
  )
  {
    mJointType = JointType5DoF;
    mDoFCount = 5;

    mJointAxes = new Math::SpatialVector[mDoFCount];

    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;
    mJointAxes[2] = axis_2;
    mJointAxes[3] = axis_3;
    mJointAxes[4] = axis_4;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
    validate_spatial_axis (mJointAxes[2]);
    validate_spatial_axis (mJointAxes[3]);
    validate_spatial_axis (mJointAxes[4]);
  }

  /** \brief Constructs a 6 DoF joint with the given motion subspaces.
   *
   * The motion subspaces are of the format:
   * \f[ (r_x, r_y, r_z, t_x, t_y, t_z) \f]
   *
   * \note So far only pure rotations or pure translations are supported.
   *
   * \param axis_0 Motion subspace for axis 0
   * \param axis_1 Motion subspace for axis 1
   * \param axis_2 Motion subspace for axis 2
   * \param axis_3 Motion subspace for axis 3
   * \param axis_4 Motion subspace for axis 4
   * \param axis_5 Motion subspace for axis 5
   */
  Joint (
    const Math::SpatialVector &axis_0,
    const Math::SpatialVector &axis_1,
    const Math::SpatialVector &axis_2,
    const Math::SpatialVector &axis_3,
    const Math::SpatialVector &axis_4,
    const Math::SpatialVector &axis_5
  )
  {
    mJointType = JointType6DoF;
    mDoFCount = 6;

    mJointAxes = new Math::SpatialVector[mDoFCount];

    mJointAxes[0] = axis_0;
    mJointAxes[1] = axis_1;
    mJointAxes[2] = axis_2;
    mJointAxes[3] = axis_3;
    mJointAxes[4] = axis_4;
    mJointAxes[5] = axis_5;

    validate_spatial_axis (mJointAxes[0]);
    validate_spatial_axis (mJointAxes[1]);
    validate_spatial_axis (mJointAxes[2]);
    validate_spatial_axis (mJointAxes[3]);
    validate_spatial_axis (mJointAxes[4]);
    validate_spatial_axis (mJointAxes[5]);
  }

  /** \brief Checks whether we have pure rotational or translational axis.
   *
   * This function is mainly used to print out warnings when specifying an
   * axis that might not be intended.
   */
  bool validate_spatial_axis (Math::SpatialVector &axis)
  {
#ifdef RBDL_USE_CASADI_MATH
      // If using casadi, the axes won't be validated
      return true;
#else
    bool axis_rotational = false;
    bool axis_translational = false;

    Math::Vector3d rotation (axis[0], axis[1], axis[2]);
    Math::Vector3d translation (axis[3], axis[4], axis[5]);

    if (fabs(rotation.norm()) > 1.0e-8) {
      axis_rotational = true;
    }

    if (fabs(translation.norm()) > 1.0e-8) {
      axis_translational = true;
    }

    if(axis_rotational && rotation.norm() - 1.0 > 1.0e-8) {
      std::cerr << "Warning: joint rotation axis is not unit!" << std::endl;
    }

    if(axis_translational && translation.norm() - 1.0 > 1.0e-8) {
      std::cerr << "Warning: joint translation axis is not unit!" << std::endl;
    }

    return axis_rotational != axis_translational;
#endif
  }

  /// \brief The spatial axes of the joint
  Math::SpatialVector* mJointAxes;
  /// \brief Type of joint
  JointType mJointType;
  /// \brief Number of degrees of freedom of the joint. Note: CustomJoints
  // have here a value of 0 and their actual numbers of degrees of freedom
  // can be obtained using the CustomJoint structure.
  unsigned int mDoFCount;
  unsigned int q_index;
  unsigned int custom_joint_index;
};

/** \brief Computes all variables for a joint model
 *
 *  By appropriate modification of this function all types of joints can be
 *  modeled. See RBDA Section 4.4 for details.
 *
 * \param model    the rigid body model
 * \param joint_id the id of the joint we are interested in. This will be used to determine the type of joint and also the entries of \f[ q, \dot{q} \f].
 * \param q        joint state variables
 * \param qdot     joint velocity variables
 */
RBDL_DLLAPI
void jcalc (
  Model &model,
  unsigned int joint_id,
  const Math::VectorNd &q,
  const Math::VectorNd &qdot
);

RBDL_DLLAPI
Math::SpatialTransform jcalc_XJ (
  Model &model,
  unsigned int joint_id,
  const Math::VectorNd &q);

RBDL_DLLAPI
void jcalc_X_lambda_S (
  Model &model,
  unsigned int joint_id,
  const Math::VectorNd &q
);

struct RBDL_DLLAPI CustomJoint {
  CustomJoint()
  { }
  virtual ~CustomJoint() {};

  virtual void jcalc (Model &model,
                      unsigned int joint_id,
                      const Math::VectorNd &q,
                      const Math::VectorNd &qdot
                     ) = 0;
  virtual void jcalc_X_lambda_S (Model &model,
                                 unsigned int joint_id,
                                 const Math::VectorNd &q
                                ) = 0;

  unsigned int mDoFCount;
  Math::SpatialTransform XJ;
  Math::MatrixNd S;
  Math::MatrixNd U;
  Math::MatrixNd Dinv;
  Math::VectorNd u;
  Math::VectorNd d_u;
};

}